

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAddCollateToken(Parse *pParse,Expr *pExpr,Token *pCollName,int dequote)

{
  Expr *pEVar1;
  Expr *pNew;
  int dequote_local;
  Token *pCollName_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pCollName_local = (Token *)pExpr;
  if ((pCollName->n != 0) &&
     (pEVar1 = sqlite3ExprAlloc(pParse->db,0x66,pCollName,dequote), pCollName_local = (Token *)pExpr
     , pEVar1 != (Expr *)0x0)) {
    pEVar1->pLeft = pExpr;
    pEVar1->flags = pEVar1->flags | 0x1100;
    pCollName_local = (Token *)pEVar1;
  }
  return (Expr *)pCollName_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateToken(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* Add the "COLLATE" clause to this expression */
  const Token *pCollName,  /* Name of collating sequence */
  int dequote              /* True to dequote pCollName */
){
  if( pCollName->n>0 ){
    Expr *pNew = sqlite3ExprAlloc(pParse->db, TK_COLLATE, pCollName, dequote);
    if( pNew ){
      pNew->pLeft = pExpr;
      pNew->flags |= EP_Collate|EP_Skip;
      pExpr = pNew;
    }
  }
  return pExpr;
}